

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O0

size_type __thiscall wabt::string_view::find(string_view *this,char *s,size_type pos,size_type n)

{
  size_type sVar1;
  string_view local_38;
  size_type local_28;
  size_type n_local;
  size_type pos_local;
  char *s_local;
  string_view *this_local;
  
  local_28 = n;
  n_local = pos;
  pos_local = (size_type)s;
  s_local = (char *)this;
  string_view(&local_38,s,n);
  sVar1 = find(this,local_38,n_local);
  return sVar1;
}

Assistant:

string_view::size_type string_view::find(const char* s,
                                         size_type pos,
                                         size_type n) const {
  return find(string_view(s, n), pos);
}